

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O3

_Bool emap_rtree_leaf_elms_lookup
                (tsdn_t *tsdn,emap_t *emap,rtree_ctx_t *rtree_ctx,edata_t *edata,_Bool dependent,
                _Bool init_missing,rtree_leaf_elm_t **r_elm_a,rtree_leaf_elm_t **r_elm_b)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  uintptr_t uVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  rtree_leaf_elm_t *prVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  _Bool _Var12;
  long lVar13;
  
  pvVar3 = edata->e_addr;
  uVar7 = (ulong)pvVar3 & 0xfffffffffffff000;
  uVar10 = (ulong)pvVar3 & 0xffffffffc0000000;
  uVar9 = (ulong)(((uint)((ulong)pvVar3 >> 0x1e) & 0xf) << 4);
  puVar11 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar9);
  uVar9 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar9);
  if (uVar9 == uVar10) {
    prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)(uVar7 >> 9) & 0x1ffff8) + puVar11[1]);
  }
  else if (rtree_ctx->l2_cache[0].leafkey == uVar10) {
    prVar8 = rtree_ctx->l2_cache[0].leaf;
    rtree_ctx->l2_cache[0].leafkey = uVar9;
    rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar11[1];
    *puVar11 = uVar10;
    puVar11[1] = (ulong)prVar8;
    prVar8 = (rtree_leaf_elm_t *)
             ((long)&(prVar8->le_bits).repr + (ulong)((uint)uVar7 >> 9 & 0x1ffff8));
  }
  else {
    lVar13 = 0x118;
    do {
      if (*(ulong *)((long)rtree_ctx->cache + lVar13 + -8) == uVar10) {
        uVar5 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + lVar13);
        puVar1 = (undefined8 *)((long)rtree_ctx->cache + lVar13 + -0x18);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)rtree_ctx->cache + lVar13 + -8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        *(ulong *)((long)rtree_ctx->cache + lVar13 + -0x18) = uVar9;
        *(ulong *)((long)(rtree_ctx->cache + -1) + lVar13) = puVar11[1];
        *puVar11 = uVar10;
        puVar11[1] = uVar5;
        prVar8 = (rtree_leaf_elm_t *)(((uint)uVar7 >> 9 & 0x1ffff8) + uVar5);
        goto LAB_01c4d33f;
      }
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x188);
    prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                       (tsdn,&emap->rtree,rtree_ctx,uVar7,dependent,init_missing);
  }
LAB_01c4d33f:
  *r_elm_a = prVar8;
  if ((dependent) || (_Var12 = true, prVar8 != (rtree_leaf_elm_t *)0x0)) {
    uVar9 = (((edata->field_2).e_size_esn & 0xfffffffffffff000) +
            ((ulong)edata->e_addr & 0xfffffffffffff000)) - 0x1000;
    uVar7 = uVar9 & 0xffffffffc0000000;
    uVar10 = (ulong)(((uint)(uVar9 >> 0x1e) & 0xf) << 4);
    puVar11 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar10);
    uVar4 = *(uintptr_t *)((long)&rtree_ctx->cache[0].leafkey + uVar10);
    if (uVar4 == uVar7) {
      prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)(uVar9 >> 9) & 0x1ffff8) + puVar11[1]);
    }
    else if (rtree_ctx->l2_cache[0].leafkey == uVar7) {
      prVar8 = rtree_ctx->l2_cache[0].leaf;
      rtree_ctx->l2_cache[0].leafkey = uVar4;
      rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar11[1];
      *puVar11 = uVar7;
      puVar11[1] = (ulong)prVar8;
      prVar8 = (rtree_leaf_elm_t *)
               ((long)&(prVar8->le_bits).repr + (ulong)((uint)uVar9 >> 9 & 0x1ffff8));
    }
    else {
      lVar13 = 0x118;
      do {
        if (*(ulong *)((long)rtree_ctx->cache + lVar13 + -8) == uVar7) {
          uVar10 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + lVar13);
          puVar1 = (undefined8 *)((long)rtree_ctx->cache + lVar13 + -0x18);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)rtree_ctx->cache + lVar13 + -8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          *(uintptr_t *)((long)rtree_ctx->cache + lVar13 + -0x18) = uVar4;
          *(ulong *)((long)(rtree_ctx->cache + -1) + lVar13) = puVar11[1];
          *puVar11 = uVar7;
          puVar11[1] = uVar10;
          prVar8 = (rtree_leaf_elm_t *)(((uint)uVar9 >> 9 & 0x1ffff8) + uVar10);
          goto LAB_01c4d3a7;
        }
        lVar13 = lVar13 + 0x10;
      } while (lVar13 != 0x188);
      prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                         (tsdn,&emap->rtree,rtree_ctx,uVar9,dependent,init_missing);
    }
LAB_01c4d3a7:
    *r_elm_b = prVar8;
    _Var12 = !dependent && prVar8 == (rtree_leaf_elm_t *)0x0;
  }
  return _Var12;
}

Assistant:

static bool
emap_rtree_leaf_elms_lookup(tsdn_t *tsdn, emap_t *emap, rtree_ctx_t *rtree_ctx,
    const edata_t *edata, bool dependent, bool init_missing,
    rtree_leaf_elm_t **r_elm_a, rtree_leaf_elm_t **r_elm_b) {
	*r_elm_a = rtree_leaf_elm_lookup(tsdn, &emap->rtree, rtree_ctx,
	    (uintptr_t)edata_base_get(edata), dependent, init_missing);
	if (!dependent && *r_elm_a == NULL) {
		return true;
	}
	assert(*r_elm_a != NULL);

	*r_elm_b = rtree_leaf_elm_lookup(tsdn, &emap->rtree, rtree_ctx,
	    (uintptr_t)edata_last_get(edata), dependent, init_missing);
	if (!dependent && *r_elm_b == NULL) {
		return true;
	}
	assert(*r_elm_b != NULL);

	return false;
}